

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_53f39::OpenXrProgram::InitializeSession(OpenXrProgram *this)

{
  XrResult XVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  undefined1 local_e0 [8];
  XrReferenceSpaceCreateInfo referenceSpaceCreateInfo;
  XrSessionCreateInfo createInfo;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  OpenXrProgram *local_10;
  OpenXrProgram *this_local;
  
  local_10 = this;
  if (this->m_instance == (XrInstance)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Check failed",&local_31);
    Throw((string *)local_30,"m_instance != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:553"
         );
  }
  if (this->m_session != (XrSession)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Check failed",&local_69);
    Throw((string *)local_68,"m_session == XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:554"
         );
  }
  Fmt_abi_cxx11_((char *)&createInfo.systemId,"Creating session...");
  Log::Write(Verbose,(string *)&createInfo.systemId);
  std::__cxx11::string::~string((string *)&createInfo.systemId);
  referenceSpaceCreateInfo.poseInReferenceSpace.position.y = 1.12104e-44;
  referenceSpaceCreateInfo.poseInReferenceSpace.position.z = 0.0;
  createInfo.type = XR_TYPE_UNKNOWN;
  createInfo._4_4_ = 0;
  createInfo.next = (void *)0x0;
  createInfo.createFlags = 0;
  peVar2 = std::__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_graphicsPlugin);
  createInfo.type = (*peVar2->_vptr_IGraphicsPlugin[5])();
  createInfo._4_4_ = extraout_var;
  createInfo.createFlags = this->m_systemId;
  XVar1 = xrCreateSession(this->m_instance,&referenceSpaceCreateInfo.poseInReferenceSpace.position.y
                          ,&this->m_session);
  CheckXrResult(XVar1,"xrCreateSession(m_instance, &createInfo, &m_session)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:562"
               );
  LogReferenceSpaces(this);
  InitializeActions(this);
  CreateVisualizedSpaces(this);
  peVar3 = std::__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_options);
  GetXrReferenceSpaceCreateInfo((XrReferenceSpaceCreateInfo *)local_e0,&peVar3->AppSpace);
  XVar1 = xrCreateReferenceSpace(this->m_session,local_e0,&this->m_appSpace);
  CheckXrResult(XVar1,"xrCreateReferenceSpace(m_session, &referenceSpaceCreateInfo, &m_appSpace)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:571"
               );
  return;
}

Assistant:

void InitializeSession() override {
        CHECK(m_instance != XR_NULL_HANDLE);
        CHECK(m_session == XR_NULL_HANDLE);

        {
            Log::Write(Log::Level::Verbose, Fmt("Creating session..."));

            XrSessionCreateInfo createInfo{XR_TYPE_SESSION_CREATE_INFO};
            createInfo.next = m_graphicsPlugin->GetGraphicsBinding();
            createInfo.systemId = m_systemId;
            CHECK_XRCMD(xrCreateSession(m_instance, &createInfo, &m_session));
        }

        LogReferenceSpaces();
        InitializeActions();
        CreateVisualizedSpaces();

        {
            XrReferenceSpaceCreateInfo referenceSpaceCreateInfo = GetXrReferenceSpaceCreateInfo(m_options->AppSpace);
            CHECK_XRCMD(xrCreateReferenceSpace(m_session, &referenceSpaceCreateInfo, &m_appSpace));
        }
    }